

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_promise_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSRuntime *pJVar1;
  JSValue new_target_00;
  JSValue func_obj;
  int iVar2;
  JSRefCountHeader *p_1;
  JSValueUnion JVar3;
  undefined4 *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  JSValueUnion JVar8;
  JSRefCountHeader *p;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue JVar9;
  JSValue JVar10;
  JSValue JVar11;
  JSValue JVar12;
  JSValue args [2];
  JSValue error;
  uint uStack_84;
  JSValueUnion local_78;
  int64_t local_70;
  JSValueUnion local_68;
  int64_t local_60;
  JSValueUnion local_50;
  JSValueUnion local_48;
  int64_t iStack_40;
  
  JVar11 = *argv;
  iVar2 = check_function(ctx,*argv);
  if (iVar2 == 0) {
    JVar9 = js_create_from_ctor(ctx,new_target,0x2a);
    uVar7 = JVar9.tag;
    JVar3 = JVar9.u;
    if ((uVar7 & 0xffffffff) != 6) {
      puVar4 = (undefined4 *)js_mallocz(ctx,0x40);
      if (puVar4 != (undefined4 *)0x0) {
        *puVar4 = 0;
        puVar4[10] = 0;
        *(undefined4 **)(puVar4 + 2) = puVar4 + 2;
        *(undefined4 **)(puVar4 + 4) = puVar4 + 2;
        *(undefined4 **)(puVar4 + 6) = puVar4 + 6;
        *(undefined4 **)(puVar4 + 8) = puVar4 + 6;
        puVar4[0xc] = 0;
        *(undefined8 *)(puVar4 + 0xe) = 3;
        if ((uint)JVar9.tag == 0xffffffff) {
          *(undefined4 **)((long)JVar3.ptr + 0x30) = puVar4;
        }
        iVar2 = js_create_resolving_functions(ctx,(JSValue *)&local_78,JVar9);
        if (iVar2 == 0) {
          JVar12.tag = 3;
          JVar12.u.ptr = (void *)((ulong)uStack_84 << 0x20);
          JVar11 = JS_CallInternal(ctx,JVar11,(JSValue)(ZEXT816(3) << 0x40),JVar12,2,
                                   (JSValue *)&local_78,2);
          JVar8 = JVar11.u;
          if ((uint)JVar11.tag == 6) {
            pJVar1 = ctx->rt;
            local_48 = (JSValueUnion)(pJVar1->current_exception).u.ptr;
            iStack_40 = (pJVar1->current_exception).tag;
            (pJVar1->current_exception).u.int32 = 0;
            (pJVar1->current_exception).tag = 2;
            func_obj.tag = local_60;
            func_obj.u.ptr = local_68.ptr;
            new_target_00.tag = 3;
            new_target_00.u.ptr = (void *)((ulong)uStack_84 << 0x20);
            local_50 = JVar11.u;
            JVar12 = JS_CallInternal(ctx,func_obj,(JSValue)(ZEXT816(3) << 0x40),new_target_00,1,
                                     (JSValue *)&local_48,2);
            if ((0xfffffff4 < (uint)iStack_40) &&
               (iVar2 = *local_48.ptr, *(int *)local_48.ptr = iVar2 + -1, iVar2 < 2)) {
              v.tag = iStack_40;
              v.u.ptr = local_48.ptr;
              __JS_FreeValueRT(ctx->rt,v);
            }
            if ((uint)JVar12.tag == 6) {
              if ((0xfffffff4 < (uint)local_70) &&
                 (iVar2 = *local_78.ptr, *(int *)local_78.ptr = iVar2 + -1, iVar2 < 2)) {
                v_00.tag = local_70;
                v_00.u.ptr = local_78.ptr;
                __JS_FreeValueRT(ctx->rt,v_00);
              }
              if ((0xfffffff4 < (uint)local_60) &&
                 (iVar2 = *local_68.ptr, *(int *)local_68.ptr = iVar2 + -1, iVar2 < 2)) {
                v_01.tag = local_60;
                v_01.u.ptr = local_68.ptr;
                __JS_FreeValueRT(ctx->rt,v_01);
              }
              goto LAB_0012f135;
            }
            JVar8 = local_50;
            if ((0xfffffff4 < (uint)JVar12.tag) &&
               (iVar2 = *JVar12.u.ptr, *(int *)JVar12.u.ptr = iVar2 + -1, iVar2 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar12);
              JVar8 = local_50;
            }
          }
          if ((0xfffffff4 < (uint)JVar11.tag) &&
             (iVar2 = *JVar8.ptr, *(int *)JVar8.ptr = iVar2 + -1, iVar2 < 2)) {
            JVar11.u.ptr = JVar8.ptr;
            __JS_FreeValueRT(ctx->rt,JVar11);
          }
          if ((0xfffffff4 < (uint)local_70) &&
             (iVar2 = *local_78.ptr, *(int *)local_78.ptr = iVar2 + -1, iVar2 < 2)) {
            JVar9.tag = local_70;
            JVar9.u.ptr = local_78.ptr;
            __JS_FreeValueRT(ctx->rt,JVar9);
          }
          if ((0xfffffff4 < (uint)local_60) &&
             (iVar2 = *local_68.ptr, *(int *)local_68.ptr = iVar2 + -1, iVar2 < 2)) {
            v_02.tag = local_60;
            v_02.u.ptr = local_68.ptr;
            __JS_FreeValueRT(ctx->rt,v_02);
          }
          uVar6 = (ulong)JVar3.ptr & 0xffffffff00000000;
          uVar5 = (ulong)JVar3.ptr & 0xffffffff;
          goto LAB_0012f160;
        }
      }
LAB_0012f135:
      if ((0xfffffff4 < (uint)JVar9.tag) &&
         (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar9);
      }
    }
  }
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 6;
LAB_0012f160:
  JVar10.u.ptr = (void *)(uVar5 | uVar6);
  JVar10.tag = uVar7;
  return JVar10;
}

Assistant:

static JSValue js_promise_constructor(JSContext *ctx, JSValueConst new_target,
                                      int argc, JSValueConst *argv)
{
    JSValueConst executor;
    JSValue obj;
    JSPromiseData *s;
    JSValue args[2], ret;
    int i;

    executor = argv[0];
    if (check_function(ctx, executor))
        return JS_EXCEPTION;
    obj = js_create_from_ctor(ctx, new_target, JS_CLASS_PROMISE);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    s = js_mallocz(ctx, sizeof(*s));
    if (!s)
        goto fail;
    s->promise_state = JS_PROMISE_PENDING;
    s->is_handled = FALSE;
    for(i = 0; i < 2; i++)
        init_list_head(&s->promise_reactions[i]);
    s->promise_result = JS_UNDEFINED;
    JS_SetOpaque(obj, s);
    if (js_create_resolving_functions(ctx, args, obj))
        goto fail;
    ret = JS_Call(ctx, executor, JS_UNDEFINED, 2, (JSValueConst *)args);
    if (JS_IsException(ret)) {
        JSValue ret2, error;
        error = JS_GetException(ctx);
        ret2 = JS_Call(ctx, args[1], JS_UNDEFINED, 1, (JSValueConst *)&error);
        JS_FreeValue(ctx, error);
        if (JS_IsException(ret2))
            goto fail1;
        JS_FreeValue(ctx, ret2);
    }
    JS_FreeValue(ctx, ret);
    JS_FreeValue(ctx, args[0]);
    JS_FreeValue(ctx, args[1]);
    return obj;
 fail1:
    JS_FreeValue(ctx, args[0]);
    JS_FreeValue(ctx, args[1]);
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}